

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DelaunayMST.h
# Opt level: O1

bool __thiscall DelaunayMST::isInCircle(DelaunayMST *this,int a,int b,int c,int d)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  Point2d *pPVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  
  pPVar6 = (this->p)._M_t.super___uniq_ptr_impl<Point2d,_std::default_delete<Point2d[]>_>._M_t.
           super__Tuple_impl<0UL,_Point2d_*,_std::default_delete<Point2d[]>_>.
           super__Head_base<0UL,_Point2d_*,_false>._M_head_impl;
  dVar1 = pPVar6[a].x;
  dVar2 = pPVar6[a].y;
  dVar13 = pPVar6[b].x;
  dVar3 = pPVar6[b].y;
  dVar14 = dVar13 * dVar13 + dVar3 * dVar3;
  dVar12 = pPVar6[c].x;
  dVar11 = pPVar6[c].y;
  dVar7 = dVar12 * dVar12 + dVar11 * dVar11;
  dVar4 = pPVar6[d].x;
  dVar5 = pPVar6[d].y;
  dVar8 = dVar14;
  dVar9 = dVar13;
  dVar10 = dVar3;
  if ((dVar11 - dVar2) * (dVar13 - dVar1) - (dVar12 - dVar1) * (dVar3 - dVar2) < 0.0) {
    dVar8 = dVar7;
    dVar9 = dVar12;
    dVar10 = dVar11;
    dVar11 = dVar3;
    dVar12 = dVar13;
    dVar7 = dVar14;
  }
  dVar13 = dVar1 * dVar1 + dVar2 * dVar2;
  return ((dVar4 * dVar4 + dVar5 * dVar5) - dVar13) *
         ((dVar11 - dVar2) * (dVar9 - dVar1) - (dVar12 - dVar1) * (dVar10 - dVar2)) +
         (dVar5 - dVar2) *
         ((dVar8 - dVar13) * (dVar12 - dVar1) - (dVar7 - dVar13) * (dVar9 - dVar1)) +
         (dVar4 - dVar1) *
         ((dVar10 - dVar2) * (dVar7 - dVar13) - (dVar11 - dVar2) * (dVar8 - dVar13)) < 0.0;
}

Assistant:

bool isInCircle(int a, int b, int c, int d)
	{
		auto mapToHiDim = [](const Point2d &p2)
		{ return Point3d{p2.x, p2.y, p2.x * p2.x + p2.y * p2.y}; };
		Point3d pa = mapToHiDim(p[a]), pb = mapToHiDim(p[b]), pc = mapToHiDim(p[c]), pd = mapToHiDim(p[d]);
		if (cross(p[a], p[b], p[c]) < 0)
			std::swap(pb, pc);
		return Point3d::dot(cross(pa, pb, pc), (pd - pa)) < 0;
	}